

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O0

void __thiscall
SAT::explainToExhaustion
          (SAT *this,set<int,_std::less<int>,_std::allocator<int>_> *contributingNogoods)

{
  uint uVar1;
  uint uVar2;
  Lit *pLVar3;
  ostream *poVar4;
  int *piVar5;
  Lit *pLVar6;
  char *pcVar7;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar8;
  int in_stack_0000007c;
  Lit q;
  uint j;
  Clause *c;
  Clause *cp;
  Lit p;
  uint i;
  vec<int> old_out_learnt_level;
  vec<Lit> old_out_learnt;
  vec<char> oldseen;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  SAT *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  vec<Lit> *in_stack_fffffffffffffe58;
  vec<Lit> *in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  ostream *in_stack_fffffffffffffe88;
  string local_d0 [32];
  Lit local_b0;
  uint local_ac;
  _Base_ptr local_a8;
  undefined1 local_a0;
  Clause *local_98;
  int local_90;
  int local_8c;
  string local_88 [32];
  int local_68;
  int local_64;
  Clause *local_60;
  int local_58;
  uint local_54;
  
  vec<char>::vec<char>
            ((vec<char> *)in_stack_fffffffffffffe60,(vec<char> *)in_stack_fffffffffffffe58);
  vec<Lit>::vec<Lit>(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  vec<int>::vec<int>((vec<int> *)in_stack_fffffffffffffe60,(vec<int> *)in_stack_fffffffffffffe58);
  for (local_54 = 0; uVar2 = local_54, uVar1 = vec<Lit>::size((vec<Lit> *)(in_RDI + 0x100)),
      uVar2 < uVar1; local_54 = local_54 + 1) {
    pLVar3 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x100),local_54);
    local_68 = pLVar3->x;
    local_58 = local_68;
    local_64 = (int)operator~((Lit)0x299a63);
    local_60 = getExpl((SAT *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       (Lit)(int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    if ((so.debug & 1U) != 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"checking literal ");
      local_90 = local_58;
      local_8c = (int)operator~((Lit)0x299af3);
      toInt((Lit)local_8c);
      getLitString_abi_cxx11_(in_stack_0000007c);
      poVar4 = std::operator<<(poVar4,local_88);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string(local_88);
    }
    if (local_60 == (Clause *)0x0) {
      if ((so.debug & 1U) != 0) {
        std::operator<<((ostream *)&std::cerr,"it has no reason\n");
      }
    }
    else {
      local_98 = local_60;
      if (((ulong)*local_60 & 1) != 0) {
        piVar5 = Clause::rawActivity(local_60);
        *piVar5 = *piVar5 + 1;
        Clause::clauseID(local_98);
        pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           in_stack_fffffffffffffe60,
                           (value_type_conflict *)in_stack_fffffffffffffe58);
        local_a8 = (_Base_ptr)pVar8.first._M_node;
        local_a0 = pVar8.second;
      }
      pLVar3 = vec<Lit>::last((vec<Lit> *)(in_RDI + 0x100));
      pLVar6 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x100),local_54);
      pLVar6->x = pLVar3->x;
      vec<Lit>::pop((vec<Lit> *)(in_RDI + 0x100));
      vec<int>::pop((vec<int> *)(in_RDI + 0x110));
      local_54 = local_54 - 1;
      for (local_ac = 1; uVar2 = local_ac, uVar1 = Clause::size(local_98), uVar2 < uVar1;
          local_ac = local_ac + 1) {
        pLVar3 = Clause::operator[]((Clause *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c);
        local_b0.x = pLVar3->x;
        if ((so.debug & 1U) != 0) {
          in_stack_fffffffffffffe88 = std::operator<<((ostream *)&std::cerr,"adding literal ");
          in_stack_fffffffffffffe84 = toInt(local_b0);
          getLitString_abi_cxx11_(in_stack_0000007c);
          std::operator<<(in_stack_fffffffffffffe88,local_d0);
          std::__cxx11::string::~string(local_d0);
        }
        in_stack_fffffffffffffe80 = ::var(local_b0);
        pcVar7 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x120),in_stack_fffffffffffffe80);
        if (*pcVar7 == '\0') {
          in_stack_fffffffffffffe60 = (vec<Lit> *)(in_RDI + 0x120);
          uVar2 = ::var(local_b0);
          in_stack_fffffffffffffe58 =
               (vec<Lit> *)vec<char>::operator[]((vec<char> *)in_stack_fffffffffffffe60,uVar2);
          *(char *)&in_stack_fffffffffffffe58->sz = '\x01';
          vec<Lit>::push((vec<Lit> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         (Lit *)in_stack_fffffffffffffe48);
          in_stack_fffffffffffffe48 = (SAT *)(in_RDI + 0x110);
          in_stack_fffffffffffffe54 = ::var(local_b0);
          in_stack_fffffffffffffe44 = getLevel(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
          vec<int>::push((vec<int> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         (int *)in_stack_fffffffffffffe48);
        }
        else if ((so.debug & 1U) != 0) {
          std::operator<<((ostream *)&std::cerr," but already seen it");
        }
        if ((so.debug & 1U) != 0) {
          std::operator<<((ostream *)&std::cerr,"\n");
        }
      }
    }
  }
  vec<char>::moveTo((vec<char> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                    (vec<char> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  vec<Lit>::moveTo((vec<Lit> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   (vec<Lit> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  vec<int>::moveTo((vec<int> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   (vec<int> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  vec<Lit>::~vec((vec<Lit> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  vec<char>::~vec((vec<char> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  return;
}

Assistant:

void SAT::explainToExhaustion(std::set<int>& contributingNogoods) {
	vec<char> oldseen(seen);
	vec<Lit> old_out_learnt(out_learnt);
	vec<int> old_out_learnt_level(out_learnt_level);

	for (unsigned int i = 0; i < out_learnt.size(); i++) {
		const Lit p = out_learnt[i];
		assert(!reason[var(p)].isLazy());
		Clause* cp = getExpl(~p);
		if (so.debug) {
			std::cerr << "checking literal " << getLitString(toInt(~p)) << "\n";
		}
		if (cp == nullptr) {
			if (so.debug) {
				std::cerr << "it has no reason\n";
			}
			continue;
		}
		Clause& c = *cp;
		if (c.learnt) {
			c.rawActivity() += 1;
			contributingNogoods.insert(c.clauseID());
		}
		out_learnt[i] = out_learnt.last();
		out_learnt.pop();
		out_learnt_level.pop();
		i--;
		for (unsigned int j = 1; j < c.size(); j++) {
			const Lit q = c[j];
			if (so.debug) {
				std::cerr << "adding literal " << getLitString(toInt(q));
			}
			if (seen[var(q)] == 0) {
				seen[var(q)] = 1;
				out_learnt.push(q);
				out_learnt_level.push(getLevel(var(q)));
			} else {
				if (so.debug) {
					std::cerr << " but already seen it";
				}
			}
			if (so.debug) {
				std::cerr << "\n";
			}
		}
	}

	oldseen.moveTo(seen);
	old_out_learnt.moveTo(out_learnt);
	old_out_learnt_level.moveTo(out_learnt_level);
}